

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i alVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int iVar11;
  parasail_result_t *ppVar12;
  __m256i *ptr;
  int32_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar13;
  int iVar14;
  int iVar15;
  __m256i *palVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong size;
  int iVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  __m256i_32_t e;
  __m256i_32_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_scan_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar1 = (profile->profile32).score;
    if (pvVar1 == (void *)0x0) {
      parasail_nw_scan_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_nw_scan_profile_avx2_256_32_cold_6();
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          parasail_nw_scan_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_scan_profile_avx2_256_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_scan_profile_avx2_256_32_cold_3();
        }
        else if (open < 0) {
          parasail_nw_scan_profile_avx2_256_32_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_scan_profile_avx2_256_32_cold_1();
        }
        else {
          iVar19 = uVar17 - 1;
          size = (ulong)uVar17 + 7 >> 3;
          iVar15 = (int)size;
          iVar24 = -open;
          iVar11 = ppVar2->min;
          uVar17 = 0x80000000 - iVar11;
          if (iVar11 != iVar24 && SBORROW4(iVar11,iVar24) == iVar11 + open < 0) {
            uVar17 = open | 0x80000000;
          }
          iVar11 = 0x7ffffffe - ppVar2->max;
          ppVar12 = parasail_result_new();
          if (ppVar12 != (parasail_result_t *)0x0) {
            ppVar12->flag = ppVar12->flag | 0x8400401;
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign_int32_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int32_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar13 = s2Len + -1;
              iVar14 = 7 - iVar19 / iVar15;
              auVar27._4_4_ = open;
              auVar27._0_4_ = open;
              auVar27._8_4_ = open;
              auVar27._12_4_ = open;
              auVar27._16_4_ = open;
              auVar27._20_4_ = open;
              auVar27._24_4_ = open;
              auVar27._28_4_ = open;
              auVar28._4_4_ = gap;
              auVar28._0_4_ = gap;
              auVar28._8_4_ = gap;
              auVar28._12_4_ = gap;
              auVar28._16_4_ = gap;
              auVar28._20_4_ = gap;
              auVar28._24_4_ = gap;
              auVar28._28_4_ = gap;
              iVar20 = uVar17 + 1;
              auVar25._4_4_ = iVar20;
              auVar25._0_4_ = iVar20;
              auVar25._8_4_ = iVar20;
              auVar25._12_4_ = iVar20;
              auVar25._16_4_ = iVar20;
              auVar25._20_4_ = iVar20;
              auVar25._24_4_ = iVar20;
              auVar25._28_4_ = iVar20;
              auVar26._4_4_ = iVar11;
              auVar26._0_4_ = iVar11;
              auVar26._8_4_ = iVar11;
              auVar26._12_4_ = iVar11;
              auVar26._16_4_ = iVar11;
              auVar26._20_4_ = iVar11;
              auVar26._24_4_ = iVar11;
              auVar26._28_4_ = iVar11;
              iVar11 = -(iVar15 * gap);
              auVar30._4_4_ = iVar11;
              auVar30._0_4_ = iVar11;
              auVar30._8_4_ = iVar11;
              auVar30._12_4_ = iVar11;
              auVar30._16_4_ = iVar11;
              auVar30._20_4_ = iVar11;
              auVar30._24_4_ = iVar11;
              auVar30._28_4_ = iVar11;
              auVar30 = vpblendd_avx2(auVar30,SUB6432(ZEXT1664((undefined1  [16])0x0),0),1);
              auVar29 = ZEXT1232(CONCAT84(SUB128(ZEXT812(0),4),iVar20));
              auVar30 = vpaddd_avx2(auVar29,auVar30);
              uVar22 = 0;
              iVar11 = iVar24;
              do {
                lVar18 = 0;
                iVar20 = iVar11;
                do {
                  *(int *)((long)&local_80 + lVar18 * 4) = iVar20;
                  lVar21 = (long)iVar20 - (ulong)(uint)open;
                  if (lVar21 < -0x7fffffff) {
                    lVar21 = -0x80000000;
                  }
                  *(int *)((long)&local_a0 + lVar18 * 4) = (int)lVar21;
                  lVar18 = lVar18 + 1;
                  iVar20 = iVar20 - iVar15 * gap;
                } while (lVar18 != 8);
                palVar16 = ptr_02 + uVar22;
                (*palVar16)[0] = local_80;
                (*palVar16)[1] = lStack_78;
                (*palVar16)[2] = lStack_70;
                (*palVar16)[3] = lStack_68;
                palVar16 = ptr + uVar22;
                (*palVar16)[0] = local_a0;
                (*palVar16)[1] = lStack_98;
                (*palVar16)[2] = lStack_90;
                (*palVar16)[3] = lStack_88;
                uVar22 = uVar22 + 1;
                iVar11 = iVar11 - gap;
              } while (uVar22 != size);
              *ptr_00 = 0;
              uVar22 = 1;
              do {
                ptr_00[uVar22] = iVar24;
                uVar22 = uVar22 + 1;
                iVar24 = iVar24 - gap;
              } while (s2Len + 1 != uVar22);
              alVar6 = (__m256i)vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar27);
              palVar16 = ptr_03 + (iVar15 - 1U);
              uVar22 = size;
              do {
                *palVar16 = alVar6;
                alVar6 = (__m256i)vpsubd_avx2((undefined1  [32])alVar6,auVar28);
                palVar16 = palVar16 + -1;
                iVar11 = (int)uVar22;
                uVar17 = iVar11 - 1;
                uVar22 = (ulong)uVar17;
              } while (uVar17 != 0 && 0 < iVar11);
              uVar22 = 1;
              if (1 < s2Len) {
                uVar22 = (ulong)(uint)s2Len;
              }
              lVar18 = (ulong)(iVar15 + (uint)(iVar15 == 0)) << 5;
              uVar23 = 0;
              auVar5 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
              auVar31 = ZEXT3264(auVar25);
              auVar32 = ZEXT3264(auVar26);
              do {
                auVar10 = vpermd_avx2(auVar5,(undefined1  [32])ptr_02[iVar15 - 1U]);
                auVar10 = vpblendd_avx2(auVar10,ZEXT432((uint)ptr_00[uVar23]),1);
                iVar11 = ppVar2->mapper[(byte)s2[uVar23]];
                auVar7 = vpsubd_avx2(auVar25,(undefined1  [32])*ptr_03);
                lVar21 = 0;
                auVar4 = auVar25;
                do {
                  auVar3 = vpaddd_avx2(auVar10,*(undefined1 (*) [32])
                                                ((long)pvVar1 + lVar21 + (long)iVar11 * size * 0x20)
                                      );
                  auVar10 = *(undefined1 (*) [32])((long)*ptr_02 + lVar21);
                  auVar8 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr + lVar21),auVar28);
                  auVar9 = vpsubd_avx2(auVar10,auVar27);
                  auVar8 = vpmaxsd_avx2(auVar8,auVar9);
                  auVar7 = vpaddd_avx2(auVar7,*(undefined1 (*) [32])((long)*ptr_03 + lVar21));
                  auVar4 = vpmaxsd_avx2(auVar4,auVar7);
                  auVar7 = vpmaxsd_avx2(auVar8,auVar3);
                  *(undefined1 (*) [32])((long)*ptr + lVar21) = auVar8;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar21) = auVar7;
                  lVar21 = lVar21 + 0x20;
                } while (lVar18 != lVar21);
                auVar10 = vpermd_avx2(auVar5,auVar7);
                lVar21 = uVar23 + 1;
                uVar23 = uVar23 + 1;
                auVar7 = vpblendd_avx2(auVar10,ZEXT432((uint)ptr_00[lVar21]),1);
                auVar10 = vpaddd_avx2(auVar7,(undefined1  [32])*ptr_03);
                auVar10 = vpmaxsd_avx2(auVar4,auVar10);
                iVar11 = 6;
                do {
                  auVar4 = vperm2i128_avx2(auVar10,auVar10,0x28);
                  auVar4 = vpalignr_avx2(auVar10,auVar4,0xc);
                  auVar4 = vpaddd_avx2(auVar4,auVar30);
                  auVar10 = vpmaxsd_avx2(auVar10,auVar4);
                  iVar11 = iVar11 + -1;
                } while (iVar11 != 0);
                auVar4 = vperm2i128_avx2(auVar10,auVar10,0x28);
                auVar10 = vpalignr_avx2(auVar10,auVar4,0xc);
                auVar10 = vpaddd_avx2(auVar10,auVar29);
                auVar4 = vpmaxsd_avx2(auVar7,auVar10);
                lVar21 = 0;
                do {
                  auVar10 = vpsubd_avx2(auVar10,auVar28);
                  auVar4 = vpsubd_avx2(auVar4,auVar27);
                  auVar10 = vpmaxsd_avx2(auVar10,auVar4);
                  auVar4 = vpmaxsd_avx2(auVar10,*(undefined1 (*) [32])((long)*ptr_01 + lVar21));
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar21) = auVar4;
                  auVar3 = vpminsd_avx2(auVar32._0_32_,auVar4);
                  auVar32 = ZEXT3264(auVar3);
                  auVar7 = vpmaxsd_avx2(auVar31._0_32_,auVar4);
                  auVar31 = ZEXT3264(auVar7);
                  lVar21 = lVar21 + 0x20;
                } while (lVar18 != lVar21);
              } while (uVar23 != uVar22);
              alVar6 = ptr_02[(uint)(iVar19 % iVar15)];
              iVar11 = alVar6[3]._4_4_;
              if (iVar19 / iVar15 < 7) {
                iVar15 = 1;
                if (1 < iVar14) {
                  iVar15 = iVar14;
                }
                do {
                  auVar30 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,0x28);
                  alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar30,0xc);
                  iVar11 = alVar6[3]._4_4_;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              auVar30 = vpcmpgtd_avx2(auVar25,auVar3);
              auVar25 = vpcmpgtd_avx2(auVar7,auVar26);
              auVar30 = vpor_avx2(auVar25,auVar30);
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                iVar11 = 0;
                iVar13 = 0;
                iVar19 = 0;
              }
              ppVar12->score = iVar11;
              ppVar12->end_query = iVar19;
              ppVar12->end_ref = iVar13;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar12;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vE, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vHp = _mm256_add_epi32(vHp, vW);
            vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[i]));
            vHt = _mm256_max_epi32(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHt = _mm256_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            vF = _mm256_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        vH = _mm256_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vF, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vH = _mm256_max_epi32(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}